

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O0

void hashtable_do_clear(hashtable_t *hashtable)

{
  hashtable_list *phVar1;
  pair_t *pair;
  list_t *next;
  list_t *list;
  hashtable_t *hashtable_local;
  
  next = (hashtable->list).next;
  while (next != &hashtable->list) {
    phVar1 = next->next;
    json_decref((json_t *)next[2].next);
    jsonp_free(next);
    next = phVar1;
  }
  return;
}

Assistant:

static void hashtable_do_clear(hashtable_t *hashtable)
{
    list_t *list, *next;
    pair_t *pair;

    for(list = hashtable->list.next; list != &hashtable->list; list = next)
    {
        next = list->next;
        pair = list_to_pair(list);
        json_decref(pair->value);
        jsonp_free(pair);
    }
}